

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Expression::visit<(anonymous_namespace)::HierarchicalVisitor&>
          (Expression *this,HierarchicalVisitor *visitor)

{
  HierarchicalVisitor *visitor_local;
  Expression *this_local;
  
  visitExpression<slang::ast::Expression_const,(anonymous_namespace)::HierarchicalVisitor&>
            (this,this,visitor);
  return;
}

Assistant:

decltype(auto) Expression::visit(TVisitor&& visitor, Args&&... args) const {
    return visitExpression(this, visitor, std::forward<Args>(args)...);
}